

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void * nn_reallocmsg(void *msg,size_t size)

{
  int iVar1;
  int *piVar2;
  void *local_10;
  
  local_10 = msg;
  iVar1 = nn_chunk_realloc(size,&local_10);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    local_10 = (void *)0x0;
  }
  return local_10;
}

Assistant:

void *nn_reallocmsg (void *msg, size_t size)
{
    int rc;

    rc = nn_chunk_realloc (size, &msg);
    if (rc == 0)
        return msg;
    errno = -rc;
    return NULL;
}